

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_bpe_session::tokenize
          (llm_tokenizer_bpe_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  vector<llm_symbol,_std::allocator<llm_symbol>_> *this_00;
  pointer *pplVar1;
  pointer plVar2;
  iterator iVar3;
  iterator iVar4;
  char *pcVar5;
  index iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  llama_token lVar9;
  int iVar10;
  pointer plVar11;
  pointer plVar12;
  llm_symbol *sym_1;
  ulong uVar13;
  llm_symbol *__args;
  ulong uVar14;
  llm_symbol *plVar15;
  pointer text_00;
  int iVar16;
  vector<llm_symbol,std::allocator<llm_symbol>> *this_01;
  int iVar17;
  bool bVar18;
  llm_symbol sym;
  string left_token;
  string right_token;
  llama_token token_multibyte;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  word_collection;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined1 local_100 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<int,std::allocator<int>> *local_b0;
  vector<llm_symbol,std::allocator<llm_symbol>> *local_a8;
  queue *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b0 = (vector<int,std::allocator<int>> *)output;
  unicode_regex_split(&local_48,(string *)text,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->tokenizer->regex_exprs);
  plVar12 = (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar12) {
    (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar12;
  }
  this_01 = (vector<llm_symbol,std::allocator<llm_symbol>> *)&this->symbols_final;
  local_78 = (string *)
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a0 = &this->work_queue;
    this_00 = &this->symbols;
    iVar17 = -1;
    text_00 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = this_01;
    do {
      local_100._0_8_ = 0;
      local_d8.field_2._M_allocated_capacity =
           (size_type)
           (this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8._M_dataplus._M_p =
           (pointer)(this->work_queue).
                    super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                    .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_d8._M_string_length =
           (size_type)
           (this->work_queue).
           super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
           .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_a0->
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ).c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_a0->
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ).c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_a0->
      super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
      ).c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      local_108 = (undefined1  [8])0x0;
      llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
                ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&local_d8);
      llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
                ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)local_118);
      plVar12 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
          super__Vector_impl_data._M_finish != plVar12) {
        (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
        super__Vector_impl_data._M_finish = plVar12;
      }
      if ((((this->vocab->pimpl)._M_t.
            super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
            super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
            super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl)->ignore_merges == true)
         && (lVar9 = llama_vocab::text_to_token(this->vocab,(string *)text_00), lVar9 != -1)) {
        local_118._0_8_ = (pointer)0xffffffffffffffff;
        local_118._8_8_ = (((string *)text_00)->_M_dataplus)._M_p;
        local_108 = (undefined1  [8])((string *)text_00)->_M_string_length;
        iVar3._M_current =
             (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::
          _M_realloc_insert<llm_symbol>(this_00,iVar3,(llm_symbol *)local_118);
        }
        else {
          (iVar3._M_current)->n = (size_t)local_108;
          (iVar3._M_current)->prev = -1;
          (iVar3._M_current)->next = -1;
          (iVar3._M_current)->text = (char *)local_118._8_8_;
          pplVar1 = &(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *pplVar1 = *pplVar1 + 1;
        }
        uVar13 = ((string *)text_00)->_M_string_length;
      }
      else {
        uVar13 = 0;
      }
      uVar14 = ((string *)text_00)->_M_string_length;
      if (uVar13 < uVar14) {
        iVar16 = 1;
        do {
          plVar11 = (pointer)unicode_len_utf8((((string *)text_00)->_M_dataplus)._M_p[uVar13]);
          local_108 = (undefined1  [8])(uVar14 - uVar13);
          if (plVar11 < (pointer)(uVar14 - uVar13)) {
            local_108 = (undefined1  [8])plVar11;
          }
          local_118._8_8_ = (((string *)text_00)->_M_dataplus)._M_p + uVar13;
          uVar13 = (long)&((pointer)local_108)->left + uVar13;
          local_118._4_4_ = iVar16;
          if (uVar13 == ((string *)text_00)->_M_string_length) {
            local_118._4_4_ = -1;
          }
          local_118._0_4_ = iVar16 + -2;
          iVar3._M_current =
               (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<llm_symbol,std::allocator<llm_symbol>>::_M_realloc_insert<llm_symbol&>
                      ((vector<llm_symbol,std::allocator<llm_symbol>> *)this_00,iVar3,
                       (llm_symbol *)local_118);
          }
          else {
            (iVar3._M_current)->n = (size_t)local_108;
            (iVar3._M_current)->prev = iVar16 + -2;
            (iVar3._M_current)->next = local_118._4_4_;
            (iVar3._M_current)->text = (char *)local_118._8_8_;
            pplVar1 = &(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *pplVar1 = *pplVar1 + 1;
          }
          uVar14 = ((string *)text_00)->_M_string_length;
          iVar16 = iVar16 + 1;
        } while (uVar13 < uVar14);
      }
      __args = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar15 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_70 = (string *)text_00;
      if (1 < (int)((ulong)((long)plVar15 - (long)__args) >> 3) * -0x55555555) {
        iVar16 = 1;
        do {
          add_new_bigram(this,iVar16 + -1,iVar16);
          iVar16 = iVar16 + 1;
          __args = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          plVar15 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          iVar10 = (int)((ulong)((long)plVar15 - (long)__args) >> 3);
        } while (SBORROW4(iVar16,iVar10 * -0x55555555) != iVar16 + iVar10 * 0x55555555 < 0);
      }
      this_01 = local_a8;
      if ((this->work_queue).
          super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->work_queue).
          super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          llama_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
          ::pop_move((llm_bigram_bpe *)local_118,local_a0);
          plVar12 = (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if (plVar12[(int)local_118._0_4_].n != 0) {
            uVar7 = local_118._4_4_;
            if (plVar12[(int)local_118._4_4_].n != 0) {
              plVar2 = plVar12 + (int)local_118._0_4_;
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,plVar2->text,
                         plVar2->text + plVar12[(int)local_118._0_4_].n);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,plVar12[(int)uVar7].text,
                         plVar12[(int)uVar7].text + plVar12[(int)uVar7].n);
              std::operator+(&local_68,&local_d8,&local_98);
              uVar8 = local_68._M_dataplus._M_p._4_4_;
              lVar9 = (llama_token)local_68._M_dataplus._M_p;
              if ((undefined1  [8])local_68._M_string_length == local_108) {
                if ((pointer)local_68._M_string_length == (pointer)0x0) {
                  bVar18 = false;
                }
                else {
                  iVar16 = bcmp((void *)CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                                 (llama_token)local_68._M_dataplus._M_p),
                                (void *)local_118._8_8_,local_68._M_string_length);
                  bVar18 = iVar16 != 0;
                }
              }
              else {
                bVar18 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(uVar8,lVar9) != &local_68.field_2) {
                operator_delete((undefined1 *)CONCAT44(uVar8,lVar9),
                                local_68.field_2._M_allocated_capacity + 1);
              }
              if (!bVar18) {
                plVar2->n = plVar2->n + plVar12[(int)uVar7].n;
                plVar12[(int)uVar7].n = 0;
                iVar16 = plVar12[(int)uVar7].next;
                plVar2->next = iVar16;
                if (-1 < (long)iVar16) {
                  (this_00->super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar16].prev = local_118._0_4_;
                }
                add_new_bigram(this,plVar2->prev,local_118._0_4_);
                add_new_bigram(this,local_118._0_4_,plVar2->next);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              this_01 = local_a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                (ulong)(local_d8.field_2._M_allocated_capacity + 1));
              }
            }
          }
          if ((pointer)local_118._8_8_ != (pointer)local_100) {
            operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
          }
        } while ((this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 (this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        __args = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
                 .super__Vector_impl_data._M_start;
        plVar15 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; __args != plVar15; __args = __args + 1) {
        if (__args->n != 0) {
          __args->prev = iVar17;
          __args->next = -1;
          iVar3._M_current =
               (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar17 != -1) {
            *(int *)(*(long *)this_01 + 4 + (long)iVar17 * 0x18) =
                 (int)((ulong)((long)iVar3._M_current - *(long *)this_01) >> 3) * -0x55555555;
          }
          if (iVar3._M_current ==
              (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llm_symbol,std::allocator<llm_symbol>>::_M_realloc_insert<llm_symbol&>
                      (this_01,iVar3,__args);
            plVar12 = (this->symbols_final).
                      super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            (iVar3._M_current)->n = __args->n;
            iVar6 = __args->next;
            pcVar5 = __args->text;
            (iVar3._M_current)->prev = __args->prev;
            (iVar3._M_current)->next = iVar6;
            (iVar3._M_current)->text = pcVar5;
            plVar12 = (this->symbols_final).
                      super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
            (this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
            _M_impl.super__Vector_impl_data._M_finish = plVar12;
          }
          iVar17 = (int)((ulong)((long)plVar12 - *(long *)this_01) >> 3) * -0x55555555 + -1;
        }
      }
      text_00 = (pointer)(local_70 + 1);
    } while (text_00 != (pointer)local_78);
  }
  llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator=
            (&this->symbols,(vector<llm_symbol,_std::allocator<llm_symbol>_> *)this_01);
  plVar12 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (plVar12 !=
      (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar17 = 0;
    do {
      if (plVar12[iVar17].n != 0) {
        local_118._0_8_ = (pointer)local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,plVar12[iVar17].text,plVar12[iVar17].text + plVar12[iVar17].n
                  );
        lVar9 = llama_vocab::text_to_token(this->vocab,(string *)local_118);
        local_98._M_dataplus._M_p._0_4_ = lVar9;
        if (lVar9 == -1) {
          plVar11 = (pointer)local_118._0_8_;
          if ((pointer)local_118._8_8_ != (pointer)0x0) {
            do {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
              local_68._M_dataplus._M_p._0_4_ = llama_vocab::text_to_token(this->vocab,&local_d8);
              if ((llama_token)local_68._M_dataplus._M_p != -1) {
                iVar4._M_current = *(int **)(local_b0 + 8);
                if (iVar4._M_current == *(int **)(local_b0 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_b0,iVar4,(int *)&local_68);
                }
                else {
                  *iVar4._M_current = (llama_token)local_68._M_dataplus._M_p;
                  *(int **)(local_b0 + 8) = iVar4._M_current + 1;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                (ulong)(local_d8.field_2._M_allocated_capacity + 1));
              }
              plVar11 = (pointer)((long)&plVar11->left + 1);
            } while (plVar11 != (pointer)(local_118._0_8_ + local_118._8_8_));
          }
        }
        else {
          iVar4._M_current = *(int **)(local_b0 + 8);
          if (iVar4._M_current == *(int **)(local_b0 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_b0,iVar4,(int *)&local_98);
          }
          else {
            *iVar4._M_current = lVar9;
            *(int **)(local_b0 + 8) = iVar4._M_current + 1;
          }
        }
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)((long)local_108 + 1));
        }
        plVar12 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      iVar17 = plVar12[iVar17].next;
    } while (iVar17 != -1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        int final_prev_index = -1;
        const auto word_collection = unicode_regex_split(text, tokenizer.regex_exprs);

        symbols_final.clear();

        for (const auto & word : word_collection) {
            work_queue = llm_bigram_bpe::queue();
            symbols.clear();

            int index = 0;
            size_t offset = 0;

            //if (vocab.tokenizer_ignore_merges && vocab.token_to_id.find(word) != vocab.token_to_id.end()) {
            if (vocab.get_ignore_merges() && vocab.text_to_token(word) != LLAMA_TOKEN_NULL) {
                symbols.emplace_back(llm_symbol{-1, -1, word.c_str(), word.size()});
                offset = word.size();
            }

            while (offset < word.size()) {
                llm_symbol sym;
                size_t char_len = std::min(word.size() - offset, (size_t) unicode_len_utf8(word[offset]));
                sym.text = word.c_str() + offset;
                sym.n = char_len;
                offset += sym.n;
                sym.prev = index - 1;
                sym.next = offset == word.size() ? -1 : index + 1;
                index++;
                symbols.emplace_back(sym);
            }
            for (int i = 1; i < (int) symbols.size(); ++i) {
                add_new_bigram(i - 1, i);
            }

            // build token(s)
            while (!work_queue.empty()) {
                auto bigram = work_queue.pop_move();

                auto & left_symbol = symbols[bigram.left];
                auto & right_symbol = symbols[bigram.right];

                if (left_symbol.n == 0 || right_symbol.n == 0) {
                    continue;
                }
                std::string left_token = std::string(left_symbol.text, left_symbol.n);
                std::string right_token = std::string(right_symbol.text, right_symbol.n);
                if (left_token + right_token != bigram.text) {
                    continue;  // Skip this bigram if it's outdated
                }

                // merge the right sym into the left one
                left_symbol.n += right_symbol.n;
                right_symbol.n = 0;

                // remove the right sym from the chain
                left_symbol.next = right_symbol.next;
                if (right_symbol.next >= 0) {
                    symbols[right_symbol.next].prev = bigram.left;
                }

                add_new_bigram(left_symbol.prev, bigram.left);  // left side of current symbol
                add_new_bigram(bigram.left, left_symbol.next);  // right side of current symbol
            }

            // add the finished tokens to the final list keeping correct order for next and prev
            for (auto & sym : symbols) {
                if (sym.n > 0) {
                    sym.prev = final_prev_index;
                    sym.next = -1;
                    if (final_prev_index != -1) {
                        symbols_final[final_prev_index].next = symbols_final.size();
                    }
                    symbols_final.emplace_back(sym);
                    final_prev_index = symbols_final.size() - 1;
                }
            }
        }

        symbols = symbols_final;

        if (!symbols.empty()) {
            for (int i = 0; i != -1; i = symbols[i].next) {
                auto & symbol = symbols[i];
                if (symbol.n == 0) {
                    continue;
                }

                const std::string str = std::string(symbol.text, symbol.n);
                const auto token = vocab.text_to_token(str);

                if (token == LLAMA_TOKEN_NULL) {
                    for (auto j = str.begin(); j != str.end(); ++j) {
                        std::string byte_str(1, *j);
                        auto token_multibyte = vocab.text_to_token(byte_str);
                        if (token_multibyte != LLAMA_TOKEN_NULL) {
                            output.push_back(token_multibyte);
                        }
                    }
                } else {
                    output.push_back(token);
                }
            }
        }
    }